

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall spirv_cross::Compiler::parse_fixup(Compiler *this)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  Variant *this_00;
  Types TVar2;
  StorageClass SVar3;
  Variant *pVVar4;
  bool bVar5;
  uint32_t uVar6;
  SPIRConstant *pSVar7;
  SPIRVariable *v;
  __node_base *p_Var8;
  TypedID<(spirv_cross::Types)0> *pTVar9;
  uint32_t local_48;
  uint32_t local_44;
  __node_base *local_40;
  SmallVector<unsigned_int,_8UL> *local_38;
  
  pTVar9 = (this->ir).ids_for_constant_or_variable.
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  pTVar1 = pTVar9 + (this->ir).ids_for_constant_or_variable.
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_38 = &this->aliased_variables;
  local_40 = &(this->ir).entry_points._M_h._M_before_begin;
  for (; pTVar9 != pTVar1; pTVar9 = pTVar9 + 1) {
    pVVar4 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
    this_00 = pVVar4 + pTVar9->id;
    TVar2 = pVVar4[pTVar9->id].type;
    if (TVar2 == TypeVariable) {
      v = Variant::get<spirv_cross::SPIRVariable>(this_00);
      SVar3 = v->storage;
      if (((SVar3 < StorageClassFunction) && ((0x58U >> (SVar3 & 0x1f) & 1) != 0)) ||
         (SVar3 == StorageClassTaskPayloadWorkgroupEXT)) {
        local_44 = (v->super_IVariant).self.id;
        SmallVector<unsigned_int,_8UL>::push_back(&this->global_variables,&local_44);
      }
      bVar5 = variable_storage_is_aliased(this,v);
      if (bVar5) {
        local_48 = (v->super_IVariant).self.id;
        SmallVector<unsigned_int,_8UL>::push_back(local_38,&local_48);
      }
    }
    else if (TVar2 == TypeConstant) {
      pSVar7 = Variant::get<spirv_cross::SPIRConstant>(this_00);
      bVar5 = ParsedIR::has_decoration
                        (&this->ir,(ID)(pSVar7->super_IVariant).self.id,DecorationBuiltIn);
      if (bVar5) {
        uVar6 = ParsedIR::get_decoration
                          (&this->ir,(ID)(pSVar7->super_IVariant).self.id,DecorationBuiltIn);
        if (uVar6 == 0x19) {
          uVar6 = (pSVar7->super_IVariant).self.id;
          p_Var8 = local_40;
          while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
            *(uint32_t *)&p_Var8[0x1d]._M_nxt = uVar6;
            *(uint32_t *)&p_Var8[0x1a]._M_nxt = (pSVar7->m).c[0].r[0].u32;
            *(uint32_t *)((long)&p_Var8[0x1a]._M_nxt + 4) = (pSVar7->m).c[0].r[1].u32;
            *(uint32_t *)&p_Var8[0x1b]._M_nxt = (pSVar7->m).c[0].r[2].u32;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::parse_fixup()
{
	// Figure out specialization constants for work group sizes.
	for (auto id_ : ir.ids_for_constant_or_variable)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();
			if (has_decoration(c.self, DecorationBuiltIn) &&
			    BuiltIn(get_decoration(c.self, DecorationBuiltIn)) == BuiltInWorkgroupSize)
			{
				// In current SPIR-V, there can be just one constant like this.
				// All entry points will receive the constant value.
				// WorkgroupSize take precedence over LocalSizeId.
				for (auto &entry : ir.entry_points)
				{
					entry.second.workgroup_size.constant = c.self;
					entry.second.workgroup_size.x = c.scalar(0, 0);
					entry.second.workgroup_size.y = c.scalar(0, 1);
					entry.second.workgroup_size.z = c.scalar(0, 2);
				}
			}
		}
		else if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			if (var.storage == StorageClassPrivate || var.storage == StorageClassWorkgroup ||
			    var.storage == StorageClassTaskPayloadWorkgroupEXT ||
			    var.storage == StorageClassOutput)
			{
				global_variables.push_back(var.self);
			}
			if (variable_storage_is_aliased(var))
				aliased_variables.push_back(var.self);
		}
	}
}